

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coord.cpp
# Opt level: O2

int despot::Coord::DirectionalDistance(Coord lhs,Coord rhs,int direction)

{
  switch(direction) {
  case 0:
    return rhs.y - lhs.y;
  case 1:
    return rhs.x - lhs.x;
  case 2:
    return lhs.y - rhs.y;
  case 3:
    return lhs.x - rhs.x;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/coord.cpp"
                  ,0x48,"static int despot::Coord::DirectionalDistance(Coord, Coord, int)");
  }
}

Assistant:

int Coord::DirectionalDistance(Coord lhs, Coord rhs, int direction) {
	switch (direction) {
	case Compass::NORTH:
		return rhs.y - lhs.y;
	case Compass::EAST:
		return rhs.x - lhs.x;
	case Compass::SOUTH:
		return lhs.y - rhs.y;
	case Compass::WEST:
		return lhs.x - rhs.x;
	default:
		assert(false);
		return -1;
	}
}